

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverSymbols.cpp
# Opt level: O1

BinsSelectExpr *
slang::ast::SetExprBinsSelectExpr::fromSyntax
          (SimpleBinsSelectExprSyntax *syntax,ASTContext *context)

{
  Scope *pSVar1;
  Compilation *this;
  Symbol *pSVar2;
  ExpressionSyntax *pEVar3;
  Symbol *pSVar4;
  Type *this_00;
  undefined1 auVar5 [16];
  bool bVar6;
  int iVar7;
  size_t __n;
  Expression *args;
  SetExprBinsSelectExpr *pSVar8;
  BinsSelectExpr *pBVar9;
  string_view sVar10;
  SourceRange sourceRange;
  Expression *matches;
  bitmask<slang::ast::ASTFlags> in_stack_ffffffffffffffc8;
  Expression *local_30;
  
  pSVar1 = (context->scope).ptr;
  this = pSVar1->compilation;
  pSVar2 = pSVar1->thisSym;
  pEVar3 = (syntax->expr).ptr;
  if ((pEVar3->super_SyntaxNode).kind == IdentifierName) {
    pSVar4 = pSVar2->parentScope->thisSym;
    sVar10 = parsing::Token::valueText((Token *)(pEVar3 + 1));
    __n = sVar10._M_len;
    if (__n == (pSVar4->name)._M_len) {
      if (__n != 0) {
        iVar7 = bcmp(sVar10._M_str,(pSVar4->name)._M_str,__n);
        if (iVar7 != 0) goto LAB_00333766;
      }
      if (syntax->matchesClause != (MatchesClauseSyntax *)0x0) {
        sourceRange = slang::syntax::SyntaxNode::sourceRange
                                (&syntax->matchesClause->super_SyntaxNode);
        ASTContext::addDiag(context,(DiagCode)0x610007,sourceRange);
      }
      pBVar9 = &BumpAllocator::emplace<slang::ast::CrossIdBinsSelectExpr>
                          (&this->super_BumpAllocator)->super_BinsSelectExpr;
      return pBVar9;
    }
  }
LAB_00333766:
  local_30 = (Expression *)0x0;
  if (syntax->matchesClause != (MatchesClauseSyntax *)0x0) {
    local_30 = bindCovergroupExpr(*(ExpressionSyntax **)
                                   &(syntax->matchesClause->pattern).ptr[1].super_SyntaxNode,context
                                  ,(Type *)0x0,(bitmask<slang::ast::ASTFlags>)0x200);
    bVar6 = Expression::bad(local_30);
    if (!bVar6) {
      this_00 = (local_30->type).ptr;
      if (this_00->canonical == (Type *)0x0) {
        Type::resolveCanonical(this_00);
      }
      if ((this_00->canonical->super_Symbol).kind != UnboundedType) {
        ASTContext::requireIntegral(context,local_30);
      }
    }
  }
  auVar5._8_8_ = 0;
  auVar5._0_8_ = context;
  args = Expression::bindRValue
                   ((Expression *)pSVar2[1].originatingSyntax,(Type *)(syntax->expr).ptr,
                    (ExpressionSyntax *)0x0,(SourceRange)(auVar5 << 0x40),(ASTContext *)0x0,
                    in_stack_ffffffffffffffc8);
  pSVar8 = BumpAllocator::
           emplace<slang::ast::SetExprBinsSelectExpr,slang::ast::Expression_const&,slang::ast::Expression_const*&>
                     (&this->super_BumpAllocator,args,&local_30);
  return &pSVar8->super_BinsSelectExpr;
}

Assistant:

BinsSelectExpr& SetExprBinsSelectExpr::fromSyntax(const SimpleBinsSelectExprSyntax& syntax,
                                                  const ASTContext& context) {
    auto& body = context.scope->asSymbol().as<CoverCrossBodySymbol>();
    SLANG_ASSERT(body.crossQueueType);

    auto parent = body.getParentScope();
    SLANG_ASSERT(parent);

    // If the syntax is a simple identifier that names our parent cross,
    // we're selecting the whole cross (which is otherwise not an expression).
    auto& comp = context.getCompilation();
    auto& cross = parent->asSymbol().as<CoverCrossSymbol>();
    if (syntax.expr->kind == SyntaxKind::IdentifierName &&
        syntax.expr->as<IdentifierNameSyntax>().identifier.valueText() == cross.name) {

        if (syntax.matchesClause)
            context.addDiag(diag::InvalidBinsMatches, syntax.matchesClause->sourceRange());

        return *comp.emplace<CrossIdBinsSelectExpr>();
    }

    const Expression* matches = nullptr;
    if (syntax.matchesClause) {
        matches =
            &bindCovergroupExpr(*syntax.matchesClause->pattern->as<ExpressionPatternSyntax>().expr,
                                context, nullptr, ASTFlags::AllowUnboundedLiteral);
        if (!matches->bad() && !matches->type->isUnbounded())
            context.requireIntegral(*matches);
    }

    auto& expr = Expression::bindRValue(*body.crossQueueType, *syntax.expr, {}, context);
    return *comp.emplace<SetExprBinsSelectExpr>(expr, matches);
}